

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::SymbolsWrapper::doMoveFrom(SymbolsWrapper *this,SymbolsWrapper *src)

{
  SymbolsPointerType SVar1;
  SymbolsWrapper *src_local;
  SymbolsWrapper *this_local;
  
  this->fType = src->fType;
  SVar1 = this->fType;
  if (SVar1 != SYMPTR_NONE) {
    if (SVar1 == SYMPTR_DFS) {
      this->fPtr = src->fPtr;
      (src->fPtr).dfs = (DecimalFormatSymbols *)0x0;
    }
    else if (SVar1 == SYMPTR_NS) {
      this->fPtr = src->fPtr;
      (src->fPtr).dfs = (DecimalFormatSymbols *)0x0;
    }
  }
  return;
}

Assistant:

void SymbolsWrapper::doMoveFrom(SymbolsWrapper&& src) {
    fType = src.fType;
    switch (fType) {
        case SYMPTR_NONE:
            // No action necessary
            break;
        case SYMPTR_DFS:
            fPtr.dfs = src.fPtr.dfs;
            src.fPtr.dfs = nullptr;
            break;
        case SYMPTR_NS:
            fPtr.ns = src.fPtr.ns;
            src.fPtr.ns = nullptr;
            break;
    }
}